

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  void *pvVar1;
  long in_RDI;
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiSettingsHandler *in_stack_ffffffffffffff88;
  ImVector<ImGuiSettingsHandler> *this;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  this = (ImVector<ImGuiSettingsHandler> *)0x38;
  MemAlloc(0x38);
  pvVar1 = operator_new(this);
  ImGuiDockContext::ImGuiDockContext
            ((ImGuiDockContext *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *(void **)(in_RDI + 0x2ec0) = pvVar1;
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)0x1b3944);
  ImHashStr("Docking",0,0);
  ImVector<ImGuiSettingsHandler>::push_back(this,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(g.DockContext == NULL);
    g.DockContext = IM_NEW(ImGuiDockContext)();

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}